

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentFragmentImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMDocumentFragmentImpl::cloneNode(DOMDocumentFragmentImpl *this,bool deep)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar4;
  undefined4 extraout_var;
  DOMDocumentFragmentImpl *this_01;
  DOMException *this_02;
  
  plVar2 = (long *)__dynamic_cast(this,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                  0xfffffffffffffffe);
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x18))(plVar2);
    if (lVar3 != 0) {
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar2 + 0x18))(plVar2);
      pDVar4 = DOMNodeImpl::getOwnerDocument(this_00);
      iVar1 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x26])
                        (&pDVar4->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      this_01 = (DOMDocumentFragmentImpl *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                          ((long *)CONCAT44(extraout_var,iVar1),0x60,4);
      DOMDocumentFragmentImpl(this_01,this,deep);
      DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_01)
      ;
      return (DOMNode *)this_01;
    }
  }
  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMDocumentFragmentImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (castToNodeImpl(this)->getOwnerDocument(), DOMMemoryManager::DOCUMENT_FRAGMENT_OBJECT) DOMDocumentFragmentImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}